

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

void duckdb::MaxOperation::Combine<duckdb::MinMaxState<float>,duckdb::MaxOperation>
               (MinMaxState<float> *source,MinMaxState<float> *target,AggregateInputData *param_3)

{
  bool bVar1;
  
  if (source->isset == true) {
    if (target->isset == false) {
      *target = *source;
    }
    else {
      bVar1 = GreaterThan::Operation<float>(&source->value,&target->value);
      if (bVar1) {
        target->value = source->value;
      }
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.isset) {
			// source is NULL, nothing to do
			return;
		}
		if (!target.isset) {
			// target is NULL, use source value directly
			target = source;
		} else if (LessThan::Operation(target.value, source.value)) {
			target.value = source.value;
		}
	}